

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clGetSupportedD3D10TextureFormatsINTEL
                 (cl_context context,cl_mem_flags flags,cl_mem_object_type image_type,
                 cl_uint num_entries,DXGI_FORMAT *d3d10_formats,cl_uint *num_texture_formats)

{
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar1;
  cl_int errorCode;
  CLdispatchX *pCVar2;
  time_point end;
  time_point local_98;
  string local_80;
  DXGI_FORMAT *local_60;
  cl_uint *local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x22;
  }
  local_60 = d3d10_formats;
  local_58 = num_texture_formats;
  pCVar2 = CLIntercept::dispatchX(g_pIntercept,context);
  if (pCVar2->clGetSupportedD3D10TextureFormatsINTEL ==
      (_func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr *
      )0x0) {
    return -0x22;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_flags_abi_cxx11_(&local_80,&this->m_EnumNameMap,flags);
    CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,image_type);
    CLIntercept::callLoggingEnter
              (this,"clGetSupportedD3D10TextureFormatsINTEL",enqueueCounter,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), image_type = %s (%X)",context,
               local_80._M_dataplus._M_p,flags,local_50._M_dataplus._M_p,(ulong)image_type);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar2->clGetSupportedD3D10TextureFormatsINTEL)
                        (context,flags,image_type,num_entries,local_60,local_58);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_80,"",(allocator *)&local_50);
      CLIntercept::updateHostTimingStats
                (this,"clGetSupportedD3D10TextureFormatsINTEL",&local_80,local_98,end);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar1 = (this->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00133a96;
    }
    else if (errorCode == 0) goto LAB_00133a6d;
  }
  else {
    if (errorCode == 0) {
LAB_00133a6d:
      errorCode = 0;
      goto LAB_00133a96;
    }
    CLIntercept::logError(this,"clGetSupportedD3D10TextureFormatsINTEL",errorCode);
    bVar1 = (this->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00133a96:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clGetSupportedD3D10TextureFormatsINTEL",errorCode,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_80,"",(allocator *)&local_50);
    CLIntercept::chromeCallLoggingExit
              (this,"clGetSupportedD3D10TextureFormatsINTEL",&local_80,false,0,local_98,end);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetSupportedD3D10TextureFormatsINTEL(
    cl_context context,
    cl_mem_flags flags,
    cl_mem_object_type image_type,
    cl_uint num_entries,
    DXGI_FORMAT* d3d10_formats,
    cl_uint* num_texture_formats)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clGetSupportedD3D10TextureFormatsINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), image_type = %s (%X)",
                context,
                pIntercept->enumName().name_mem_flags( flags ).c_str(),
                flags,
                pIntercept->enumName().name( image_type ).c_str(),
                image_type );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clGetSupportedD3D10TextureFormatsINTEL(
                context,
                flags,
                image_type,
                num_entries,
                d3d10_formats,
                num_texture_formats);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }
    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}